

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_4x8(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  memset(data,0,0x100);
  uVar4 = (ulong)start_col;
  for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 8) {
    lVar5 = *(long *)((long)sample_data + lVar14);
    bVar1 = *(byte *)(lVar5 + 3 + uVar4);
    iVar10 = (uint)*(byte *)(lVar5 + uVar4) + (uint)bVar1;
    bVar2 = *(byte *)(lVar5 + 1 + uVar4);
    bVar3 = *(byte *)(lVar5 + 2 + uVar4);
    iVar12 = (uint)bVar2 + (uint)bVar3;
    lVar6 = (ulong)*(byte *)(lVar5 + uVar4) - (ulong)bVar1;
    lVar5 = (ulong)bVar2 - (ulong)bVar3;
    data[lVar14] = (iVar12 + iVar10) * 8 + -0x1000;
    data[lVar14 + 2] = (iVar10 - iVar12) * 8;
    lVar7 = (lVar5 + lVar6) * 0x1151;
    data[lVar14 + 1] = (DCTELEM)(lVar6 * 0x187e + lVar7 + 0x200U >> 10);
    data[lVar14 + 3] = (DCTELEM)(lVar5 * 0x3ffffffc4df + lVar7 + 0x200U >> 10);
  }
  for (lVar14 = 0; (int)lVar14 != 4; lVar14 = lVar14 + 1) {
    iVar10 = data[lVar14];
    lVar9 = (long)(data[lVar14 + 0x38] + iVar10);
    lVar8 = (long)(data[lVar14 + 0x30] + data[lVar14 + 8]);
    lVar6 = (long)(data[lVar14 + 0x28] + data[lVar14 + 0x10]);
    lVar5 = (long)(data[lVar14 + 0x18] + data[lVar14 + 0x20]);
    lVar15 = lVar9 + lVar5 + 2;
    lVar9 = lVar9 - lVar5;
    lVar5 = lVar8 + lVar6;
    lVar8 = lVar8 - lVar6;
    data[lVar14] = (DCTELEM)((ulong)(lVar15 + lVar5) >> 2);
    lVar13 = (long)(iVar10 - data[lVar14 + 0x38]);
    lVar11 = (long)(data[lVar14 + 8] - data[lVar14 + 0x30]);
    lVar7 = (long)(data[lVar14 + 0x10] - data[lVar14 + 0x28]);
    lVar6 = (long)(data[lVar14 + 0x18] - data[lVar14 + 0x20]);
    data[lVar14 + 0x20] = (DCTELEM)((ulong)(lVar15 - lVar5) >> 2);
    lVar5 = (lVar9 + lVar8) * 0x1151;
    data[lVar14 + 0x10] = (DCTELEM)(lVar9 * 0x187e + lVar5 + 0x4000U >> 0xf);
    data[lVar14 + 0x30] = (DCTELEM)(lVar5 + lVar8 * 0x7fffffffc4df + 0x4000U >> 0xf);
    lVar8 = (lVar6 + lVar11 + lVar7 + lVar13) * 0x25a1;
    lVar5 = (lVar7 + lVar13) * -0xc7c + lVar8 + 0x4000;
    lVar8 = (lVar6 + lVar11) * -0x3ec5 + lVar8 + 0x4000;
    lVar9 = (lVar6 + lVar13) * -0x1ccd;
    data[lVar14 + 8] = (DCTELEM)((ulong)(lVar13 * 0x300b + lVar9 + lVar5) >> 0xf);
    lVar13 = (lVar7 + lVar11) * -0x5203;
    data[lVar14 + 0x18] = (DCTELEM)((ulong)(lVar11 * 0x6254 + lVar13 + lVar8) >> 0xf);
    data[lVar14 + 0x28] = (DCTELEM)((ulong)(lVar7 * 0x41b3 + lVar13 + lVar5) >> 0xf);
    data[lVar14 + 0x38] = (DCTELEM)((ulong)(lVar6 * 0x98e + lVar9 + lVar8) >> 0xf);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x8 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by 8/4 = 2, which we add here. */
  /* 4-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16). */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+1));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-2);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-1);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    /* Add fudge factor here for final descale. */
    tmp10 = tmp0 + tmp3 + (ONE << (PASS1_BITS-1));
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) RIGHT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865), CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065), CONST_BITS+PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}